

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void wasm::ModuleUtils::
     renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
               (Module *wasm,
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *map)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  string_view *other;
  Function *this;
  Function *pFVar3;
  bool local_2a9;
  undefined1 local_2a8 [8];
  PassRunner runner;
  undefined1 local_180 [8];
  Updater updater;
  Function *func;
  type *newName;
  type *oldName;
  _Self local_30;
  iterator __end0;
  iterator __begin0;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *__range2;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *map_local;
  Module *wasm_local;
  
  __end0 = std::
           map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::begin(map);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::end(map);
  do {
    bVar1 = std::operator!=(&__end0,&local_30);
    if (!bVar1) {
      Module::updateMaps(wasm);
      renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::
      pair<wasm::Name_const,wasm::Name>>>>(wasm::Module&,std::map<wasm::Name,wasm::Name,std::
      less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>&)::Updater::
      Updater(std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::
      Name_const,wasm::Name>_>_>__(local_180,map);
      renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::
      pair<wasm::Name_const,wasm::Name>>>>(wasm::Module&,std::map<wasm::Name,wasm::Name,std::
      less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>&)::Updater::
      maybeUpdate(wasm::Name__(local_180,&wasm->start);
      PassRunner::PassRunner((PassRunner *)local_2a8,wasm);
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)local_180,
                 (PassRunner *)local_2a8,wasm);
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::runOnModuleCode
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)local_180,
                 (PassRunner *)local_2a8,wasm);
      PassRunner::~PassRunner((PassRunner *)local_2a8);
      renameFunctions<std::map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>
      ::Updater::~Updater((Updater *)local_180);
      return;
    }
    __in = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Name>_>::operator*(&__end0);
    ptVar2 = std::get<0ul,wasm::Name_const,wasm::Name>(__in);
    other = (string_view *)std::get<1ul,wasm::Name_const,wasm::Name>(__in);
    this = Module::getFunctionOrNull(wasm,(Name)(ptVar2->super_IString).str);
    if (this != (Function *)0x0) {
      updater.map = (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     *)other->_M_len;
      pFVar3 = Module::getFunctionOrNull(wasm,(Name)*other);
      local_2a9 = true;
      if (pFVar3 != (Function *)0x0) {
        local_2a9 = IString::operator==((IString *)this,(IString *)other);
      }
      if (local_2a9 == false) {
        __assert_fail("!wasm.getFunctionOrNull(newName) || func->name == newName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                      ,0xb8,
                      "void wasm::ModuleUtils::renameFunctions(Module &, T &) [T = std::map<wasm::Name, wasm::Name>]"
                     );
      }
      wasm::Name::operator=((Name *)this,(Name *)other);
    }
    std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Name>_>::operator++(&__end0);
  } while( true );
}

Assistant:

inline void renameFunctions(Module& wasm, T& map) {
  // Update the function itself.
  for (auto& [oldName, newName] : map) {
    if (Function* func = wasm.getFunctionOrNull(oldName)) {
      assert(!wasm.getFunctionOrNull(newName) || func->name == newName);
      func->name = newName;
    }
  }
  wasm.updateMaps();

  // Update all references to it.
  struct Updater : public WalkerPass<PostWalker<Updater>> {
    bool isFunctionParallel() override { return true; }

    T& map;

    void maybeUpdate(Name& name) {
      if (auto iter = map.find(name); iter != map.end()) {
        name = iter->second;
      }
    }

    Updater(T& map) : map(map) {}

    std::unique_ptr<Pass> create() override {
      return std::make_unique<Updater>(map);
    }

    void visitCall(Call* curr) { maybeUpdate(curr->target); }

    void visitRefFunc(RefFunc* curr) { maybeUpdate(curr->func); }
  };

  Updater updater(map);
  updater.maybeUpdate(wasm.start);
  PassRunner runner(&wasm);
  updater.run(&runner, &wasm);
  updater.runOnModuleCode(&runner, &wasm);
}